

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O1

void __thiscall icu_63::RBBISetBuilder::buildRanges(RBBISetBuilder *this)

{
  UnicodeSet *pUVar1;
  char cVar2;
  UBool UVar3;
  int32_t iVar4;
  UChar32 where;
  UChar32 UVar5;
  int32_t iVar6;
  RangeDescriptor *pRVar7;
  void *obj;
  RBBINode *usetNode;
  int iVar8;
  RangeDescriptor *pRVar9;
  int32_t index;
  size_t in_RSI;
  UnicodeString bofString;
  UnicodeString eofString;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  pRVar7 = (RangeDescriptor *)UMemory::operator_new((UMemory *)0x20,in_RSI);
  if (pRVar7 == (RangeDescriptor *)0x0) {
    pRVar7 = (RangeDescriptor *)0x0;
  }
  else {
    RangeDescriptor::RangeDescriptor(pRVar7,this->fStatus);
  }
  this->fRangeList = pRVar7;
  if (pRVar7 == (RangeDescriptor *)0x0) {
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    pRVar7->fStartChar = 0;
    pRVar7->fEndChar = 0x10ffff;
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar8 = 0;
      obj = UVector::elementAt(this->fRB->fUSetNodes,0);
      while (obj != (void *)0x0) {
        pUVar1 = *(UnicodeSet **)((long)obj + 0x20);
        iVar4 = UnicodeSet::getRangeCount(pUVar1);
        if (0 < iVar4) {
          pRVar7 = this->fRangeList;
          index = 0;
          do {
            where = UnicodeSet::getRangeStart(pUVar1,index);
            UVar5 = UnicodeSet::getRangeEnd(pUVar1,index);
            for (; pRVar7->fEndChar < where; pRVar7 = pRVar7->fNext) {
            }
            if (pRVar7->fStartChar < where) {
              RangeDescriptor::split(pRVar7,where,this->fStatus);
              cVar2 = (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) * '\x05' + '\x01';
            }
            else {
              if (UVar5 < pRVar7->fEndChar) {
                RangeDescriptor::split(pRVar7,UVar5 + 1,this->fStatus);
                cVar2 = '\x01';
                if (U_ZERO_ERROR < *this->fStatus) goto LAB_002a1801;
              }
              iVar6 = UVector::indexOf(pRVar7->fIncludesSets,obj,0);
              if (iVar6 == -1) {
                UVector::addElement(pRVar7->fIncludesSets,obj,this->fStatus);
                cVar2 = '\x01';
                if (U_ZERO_ERROR < *this->fStatus) goto LAB_002a1801;
              }
              index = index + (uint)(UVar5 == pRVar7->fEndChar);
              pRVar7 = pRVar7->fNext;
              cVar2 = '\0';
            }
LAB_002a1801:
            if ((cVar2 != '\x06') && (cVar2 != '\0')) goto LAB_002a1815;
          } while (index < iVar4);
          cVar2 = '\0';
LAB_002a1815:
          if (cVar2 != '\0') {
            return;
          }
        }
        iVar8 = iVar8 + 1;
        obj = UVector::elementAt(this->fRB->fUSetNodes,iVar8);
      }
      for (pRVar7 = this->fRangeList; pRVar7 != (RangeDescriptor *)0x0; pRVar7 = pRVar7->fNext) {
        for (pRVar9 = this->fRangeList; pRVar9 != pRVar7; pRVar9 = pRVar9->fNext) {
          UVar3 = UVector::equals(pRVar7->fIncludesSets,pRVar9->fIncludesSets);
          if (UVar3 != '\0') {
            pRVar7->fNum = pRVar9->fNum;
            break;
          }
        }
        if (pRVar7->fNum == 0) {
          iVar8 = this->fGroupCount;
          this->fGroupCount = iVar8 + 1;
          pRVar7->fNum = iVar8 + 3;
          RangeDescriptor::setDictionaryFlag(pRVar7);
          addValToSets(this,pRVar7->fIncludesSets,this->fGroupCount + 2);
        }
      }
      UnicodeString::UnicodeString(&local_70,L"eof");
      UnicodeString::UnicodeString(&local_b0,L"bof");
      iVar8 = 0;
      while (usetNode = (RBBINode *)UVector::elementAt(this->fRB->fUSetNodes,iVar8),
            usetNode != (RBBINode *)0x0) {
        pUVar1 = usetNode->fInputSet;
        UVar3 = UnicodeSet::contains(pUVar1,&local_70);
        if (UVar3 != '\0') {
          addValToSet(this,usetNode,1);
        }
        UVar3 = UnicodeSet::contains(pUVar1,&local_b0);
        if (UVar3 != '\0') {
          addValToSet(this,usetNode,2);
          this->fSawBOF = '\x01';
        }
        iVar8 = iVar8 + 1;
      }
      UnicodeString::~UnicodeString(&local_b0);
      UnicodeString::~UnicodeString(&local_70);
    }
  }
  return;
}

Assistant:

void RBBISetBuilder::buildRanges() {
    RBBINode        *usetNode;
    RangeDescriptor *rlRange;

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "usets")) {printSets();}

    //
    //  Initialize the process by creating a single range encompassing all characters
    //  that is in no sets.
    //
    fRangeList                = new RangeDescriptor(*fStatus); // will check for status here
    if (fRangeList == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fRangeList->fStartChar    = 0;
    fRangeList->fEndChar      = 0x10ffff;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //
    //  Find the set of non-overlapping ranges of characters
    //
    int  ni;
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }

        UnicodeSet      *inputSet             = usetNode->fInputSet;
        int32_t          inputSetRangeCount   = inputSet->getRangeCount();
        int              inputSetRangeIndex   = 0;
                         rlRange              = fRangeList;

        for (;;) {
            if (inputSetRangeIndex >= inputSetRangeCount) {
                break;
            }
            UChar32      inputSetRangeBegin  = inputSet->getRangeStart(inputSetRangeIndex);
            UChar32      inputSetRangeEnd    = inputSet->getRangeEnd(inputSetRangeIndex);

            // skip over ranges from the range list that are completely
            //   below the current range from the input unicode set.
            while (rlRange->fEndChar < inputSetRangeBegin) {
                rlRange = rlRange->fNext;
            }

            // If the start of the range from the range list is before with
            //   the start of the range from the unicode set, split the range list range
            //   in two, with one part being before (wholly outside of) the unicode set
            //   and the other containing the rest.
            //   Then continue the loop; the post-split current range will then be skipped
            //     over
            if (rlRange->fStartChar < inputSetRangeBegin) {
                rlRange->split(inputSetRangeBegin, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
                continue;
            }

            // Same thing at the end of the ranges...
            // If the end of the range from the range list doesn't coincide with
            //   the end of the range from the unicode set, split the range list
            //   range in two.  The first part of the split range will be
            //   wholly inside the Unicode set.
            if (rlRange->fEndChar > inputSetRangeEnd) {
                rlRange->split(inputSetRangeEnd+1, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // The current rlRange is now entirely within the UnicodeSet range.
            // Add this unicode set to the list of sets for this rlRange
            if (rlRange->fIncludesSets->indexOf(usetNode) == -1) {
                rlRange->fIncludesSets->addElement(usetNode, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // Advance over ranges that we are finished with.
            if (inputSetRangeEnd == rlRange->fEndChar) {
                inputSetRangeIndex++;
            }
            rlRange = rlRange->fNext;
        }
    }

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "range")) { printRanges();}

    //
    //  Group the above ranges, with each group consisting of one or more
    //    ranges that are in exactly the same set of original UnicodeSets.
    //    The groups are numbered, and these group numbers are the set of
    //    input symbols recognized by the run-time state machine.
    //
    //    Numbering: # 0  (state table column 0) is unused.
    //               # 1  is reserved - table column 1 is for end-of-input
    //               # 2  is reserved - table column 2 is for beginning-in-input
    //               # 3  is the first range list.
    //
    RangeDescriptor *rlSearchRange;
    for (rlRange = fRangeList; rlRange!=0; rlRange=rlRange->fNext) {
        for (rlSearchRange=fRangeList; rlSearchRange != rlRange; rlSearchRange=rlSearchRange->fNext) {
            if (rlRange->fIncludesSets->equals(*rlSearchRange->fIncludesSets)) {
                rlRange->fNum = rlSearchRange->fNum;
                break;
            }
        }
        if (rlRange->fNum == 0) {
            fGroupCount ++;
            rlRange->fNum = fGroupCount+2; 
            rlRange->setDictionaryFlag();
            addValToSets(rlRange->fIncludesSets, fGroupCount+2);
        }
    }

    // Handle input sets that contain the special string {eof}.
    //   Column 1 of the state table is reserved for EOF on input.
    //   Column 2 is reserved for before-the-start-input.
    //            (This column can be optimized away later if there are no rule
    //             references to {bof}.)
    //   Add this column value (1 or 2) to the equivalent expression
    //     subtree for each UnicodeSet that contains the string {eof}
    //   Because {bof} and {eof} are not a characters in the normal sense,
    //   they doesn't affect the computation of ranges or TRIE.
    static const UChar eofUString[] = {0x65, 0x6f, 0x66, 0};
    static const UChar bofUString[] = {0x62, 0x6f, 0x66, 0};

    UnicodeString eofString(eofUString);
    UnicodeString bofString(bofUString);
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }
        UnicodeSet      *inputSet = usetNode->fInputSet;
        if (inputSet->contains(eofString)) {
            addValToSet(usetNode, 1);
        }
        if (inputSet->contains(bofString)) {
            addValToSet(usetNode, 2);
            fSawBOF = TRUE;
        }
    }


    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "rgroup")) {printRangeGroups();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "esets")) {printSets();}
}